

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void move_item_forward(c2m_ctx_t c2m_ctx,MIR_item_t item)

{
  unsigned_long uVar1;
  long lVar2;
  MIR_item_t pMVar3;
  MIR_module_t pMVar4;
  MIR_item_t pMVar5;
  char *name;
  MIR_item_t pMVar6;
  DLIST_MIR_item_t *list;
  
  uVar1 = c2m_ctx->env[0].__saved_mask.__val[0xd];
  if (uVar1 == 0) {
    __assert_fail("curr_func != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2d6f,"void move_item_forward(c2m_ctx_t, MIR_item_t)");
  }
  lVar2 = *(long *)(uVar1 + 8);
  if (*(MIR_item_t *)(lVar2 + 0x18) != item) {
    return;
  }
  list = (DLIST_MIR_item_t *)(lVar2 + 0x10);
  pMVar6 = item;
  DLIST_MIR_item_t_remove(list,item);
  if (((item == (MIR_item_t)0x0) ||
      (pMVar3 = (MIR_item_t)c2m_ctx->env[0].__saved_mask.__val[0xd], pMVar3 == (MIR_item_t)0x0)) ||
     (pMVar4 = pMVar3->module, (pMVar4->items).tail == (MIR_item_t_conflict)0x0)) {
    move_item_forward_cold_3();
  }
  else {
    pMVar5 = (pMVar3->item_link).prev;
    pMVar6 = (pMVar4->items).head;
    if (pMVar5 == (MIR_item_t)0x0) {
      if (pMVar6 == pMVar3) {
        (pMVar3->item_link).prev = item;
        (item->item_link).next = pMVar3;
        (item->item_link).prev = (MIR_item_t)0x0;
        (pMVar4->items).head = item;
        return;
      }
      goto LAB_001a9bec;
    }
    if (pMVar6 != (MIR_item_t)0x0) {
      (pMVar5->item_link).next = item;
      (item->item_link).prev = pMVar5;
      (pMVar3->item_link).prev = item;
      (item->item_link).next = pMVar3;
      return;
    }
  }
  move_item_forward_cold_1();
LAB_001a9bec:
  move_item_forward_cold_2();
  pMVar4 = pMVar6->module;
  if ((*(int *)&pMVar6->data != 0x7d) &&
     (((*(int *)&pMVar6->data != 0x55 || (**(int **)(*(long *)&pMVar6->item_type + 0x18) != 0x5d))
      || (((pMVar4->items).tail != list[0x18].head ||
          ((*(int *)(pMVar4[1].name + 0x18) == 7 || (((ulong)(pMVar4->module_link).next & 3) != 0)))
          ))))) {
    return;
  }
  if (*(int *)&pMVar4[1].data != 0x58) {
    MIR_new_forward((MIR_context_t)list->head,name);
    return;
  }
  MIR_new_export((MIR_context_t)list->head,name);
  return;
}

Assistant:

static void move_item_forward (c2m_ctx_t c2m_ctx, MIR_item_t item) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;

  assert (curr_func != NULL);
  if (DLIST_TAIL (MIR_item_t, curr_func->module->items) != item) return;
  DLIST_REMOVE (MIR_item_t, curr_func->module->items, item);
  DLIST_INSERT_BEFORE (MIR_item_t, curr_func->module->items, curr_func, item);
}